

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncodingTable.cpp
# Opt level: O0

bool __thiscall Trie::findLongestPrefix(Trie *this,char *text,size_t *result)

{
  bool bVar1;
  reference pvVar2;
  pointer ppVar3;
  _Self local_50;
  _Self local_48;
  iterator it;
  LookupEntry lookupEntry;
  size_t valueNode;
  size_t node;
  size_t *result_local;
  char *text_local;
  Trie *this_local;
  
  valueNode = 0;
  lookupEntry.input = '\0';
  lookupEntry._9_7_ = 0;
  result_local = (size_t *)text;
  while ((char)*result_local != '\0') {
    pvVar2 = std::vector<Trie::Node,_std::allocator<Trie::Node>_>::operator[]
                       (&this->nodes,valueNode);
    if ((pvVar2->hasValue & 1U) != 0) {
      lookupEntry._8_8_ = valueNode;
    }
    it._M_node = (_Base_ptr)valueNode;
    result_local = (size_t *)((long)result_local + 1);
    local_48._M_node =
         (_Base_ptr)
         std::
         map<Trie::LookupEntry,_unsigned_long,_std::less<Trie::LookupEntry>,_std::allocator<std::pair<const_Trie::LookupEntry,_unsigned_long>_>_>
         ::find(&this->lookup,(key_type *)&it);
    local_50._M_node =
         (_Base_ptr)
         std::
         map<Trie::LookupEntry,_unsigned_long,_std::less<Trie::LookupEntry>,_std::allocator<std::pair<const_Trie::LookupEntry,_unsigned_long>_>_>
         ::end(&this->lookup);
    bVar1 = std::operator==(&local_48,&local_50);
    if (bVar1) break;
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_Trie::LookupEntry,_unsigned_long>_>::operator->
                       (&local_48);
    valueNode = ppVar3->second;
  }
  pvVar2 = std::vector<Trie::Node,_std::allocator<Trie::Node>_>::operator[](&this->nodes,valueNode);
  if ((pvVar2->hasValue & 1U) != 0) {
    lookupEntry._8_8_ = valueNode;
  }
  pvVar2 = std::vector<Trie::Node,_std::allocator<Trie::Node>_>::operator[]
                     (&this->nodes,lookupEntry._8_8_);
  *result = pvVar2->value;
  pvVar2 = std::vector<Trie::Node,_std::allocator<Trie::Node>_>::operator[]
                     (&this->nodes,lookupEntry._8_8_);
  return (bool)(pvVar2->hasValue & 1);
}

Assistant:

bool Trie::findLongestPrefix(const char* text, size_t& result)
{
	size_t node = 0;		// root node
	size_t valueNode = 0;	// remember last node that had a value

	while (*text != 0)
	{
		if (nodes[node].hasValue)
			valueNode = node;

		LookupEntry lookupEntry { node, *text++ };
		auto it = lookup.find(lookupEntry);
		
		if (it == lookup.end())
			break;

		node = it->second;
	}
	
	if (nodes[node].hasValue)
		valueNode = node;

	result = nodes[valueNode].value;
	return nodes[valueNode].hasValue;
}